

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O2

int h264_mb_skip_flag(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  uint32_t uVar1;
  int iVar2;
  h264_macroblock *phVar3;
  h264_macroblock *phVar4;
  char *__ptr;
  
  if (cabac == (h264_cabac_context *)0x0) {
    __ptr = "mb_skip_flag used in CAVLC mode\n";
LAB_0010802c:
    fwrite(__ptr,0x20,1,_stderr);
    return 1;
  }
  uVar1 = cabac->slice->slice_type;
  iVar2 = 0xb;
  if ((uVar1 != 0) && (uVar1 != 3)) {
    if (uVar1 != 1) {
      __ptr = "mb_skip_flag used in I/SI slice\n";
      goto LAB_0010802c;
    }
    iVar2 = 0x18;
  }
  phVar3 = h264_mb_nb(cabac->slice,H264_MB_A,0);
  phVar4 = h264_mb_nb(cabac->slice,H264_MB_B,0);
  iVar2 = h264_cabac_decision(str,cabac,
                              (uint)(phVar3->mb_type - 0x3a < 0xfffffffe && phVar3->mb_type != 0x20)
                              + iVar2 + (uint)(phVar4->mb_type - 0x3a < 0xfffffffe &&
                                              phVar4->mb_type != 0x20),binVal);
  return iVar2;
}

Assistant:

int h264_mb_skip_flag(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	if (!cabac) {
		fprintf (stderr, "mb_skip_flag used in CAVLC mode\n");
		return 1;
	}
	int ctxIdxOffset, ctxIdxInc;
	if (cabac->slice->slice_type == H264_SLICE_TYPE_P || cabac->slice->slice_type == H264_SLICE_TYPE_SP) {
		ctxIdxOffset = H264_CABAC_CTXIDX_MB_SKIP_FLAG_P;
	} else if (cabac->slice->slice_type == H264_SLICE_TYPE_B) {
		ctxIdxOffset = H264_CABAC_CTXIDX_MB_SKIP_FLAG_B;
	} else {
		fprintf (stderr, "mb_skip_flag used in I/SI slice\n");
		return 1;
	}
	const struct h264_macroblock *mbA = h264_mb_nb(cabac->slice, H264_MB_A, 0);
	const struct h264_macroblock *mbB = h264_mb_nb(cabac->slice, H264_MB_B, 0);
	int condTermFlagA = (mbA->mb_type != H264_MB_TYPE_UNAVAIL && !h264_is_skip_mb_type(mbA->mb_type));
	int condTermFlagB = (mbB->mb_type != H264_MB_TYPE_UNAVAIL && !h264_is_skip_mb_type(mbB->mb_type));
	ctxIdxInc = condTermFlagA + condTermFlagB;
	return h264_cabac_decision(str, cabac, ctxIdxOffset+ctxIdxInc, binVal);
}